

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::PromiseClient::writeTarget
          (PromiseClient *this,Builder target)

{
  long *plVar1;
  RpcClient *rpcCap;
  long *plVar2;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar3;
  long in_RSI;
  RpcClient *result;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar4;
  _func_int **local_20;
  void *local_18;
  
  *(undefined1 *)(in_RSI + 0x68) = 1;
  plVar1 = *(long **)(in_RSI + 0x48);
  if ((plVar1[1] != *(long *)(*(long *)(in_RSI + 0x28) + 0xb00)) ||
     (plVar2 = plVar1, plVar1[5] != *(long *)(in_RSI + 0x28))) {
    plVar2 = (long *)0x0;
  }
  if (plVar2 == (long *)0x0) {
    (**(code **)(*plVar1 + 0x20))(&local_20);
    (this->super_RpcClient).super_ClientHook._vptr_ClientHook = local_20;
    (this->super_RpcClient).super_ClientHook.brand = local_18;
    pCVar3 = extraout_RDX_00;
  }
  else {
    (**(code **)(*plVar2 + 0x50))(this,plVar2);
    pCVar3 = extraout_RDX;
  }
  MVar4.ptr.ptr = pCVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      receivedCall = true;
      return connectionState->writeTarget(*cap, target);
    }